

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
* MatchMultiA(CScript *script)

{
  bool bVar1;
  size_type sVar2;
  difference_type dVar3;
  uchar *puVar4;
  size_type sVar5;
  const_iterator cVar6;
  opcodetype oVar7;
  optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  opcodetype opcode;
  const_iterator it;
  vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_> keyspans;
  optional<int> threshold;
  pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>
  *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe94;
  _Optional_payload_base<int> in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
  *in_stack_fffffffffffffea8;
  const_iterator *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  valtype *data_00;
  opcodetype in_stack_fffffffffffffed4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee0;
  valtype local_60;
  undefined4 local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  uchar *local_38;
  uchar *local_30;
  _Optional_payload_base<int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>::vector
            ((vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_> *)
             in_stack_fffffffffffffe88);
  sVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffe98);
  if (sVar2 != 0) {
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    if (*puVar4 == ' ') {
      puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::back
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          in_stack_fffffffffffffe98);
      if (*puVar4 == 0x9c) {
        local_30 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                                      );
        while( true ) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          local_38 = local_30;
          cVar6.ptr._4_4_ = in_stack_fffffffffffffe94;
          cVar6.ptr._0_4_ = in_stack_fffffffffffffe90;
          dVar3 = operator-((const_iterator)in_stack_fffffffffffffe98,cVar6);
          if (dVar3 < 0x22) break;
          puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                             ((const_iterator *)in_stack_fffffffffffffe88);
          if (*puVar4 != ' ') {
            std::
            optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
            ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                        *)in_stack_fffffffffffffe88);
            goto LAB_00346aae;
          }
          prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator++
                    ((const_iterator *)in_stack_fffffffffffffe88);
          in_stack_fffffffffffffee0 =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                         ((const_iterator *)in_stack_fffffffffffffe88);
          local_44 = 0x20;
          local_40 = in_stack_fffffffffffffee0;
          std::vector<Span<unsigned_char_const>,std::allocator<Span<unsigned_char_const>>>::
          emplace_back<unsigned_char_const*,int>
                    (in_stack_fffffffffffffea8,
                     (uchar **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int *)in_stack_fffffffffffffe98);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+=
                    ((const_iterator *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
          in_stack_fffffffffffffed8 =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                         ((const_iterator *)in_stack_fffffffffffffe88);
          in_stack_fffffffffffffed4 =
               (opcodetype)
               *(byte *)&(in_stack_fffffffffffffed8->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start;
          sVar5 = std::
                  vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>::
                  size((vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                        *)in_stack_fffffffffffffe88);
          oVar7 = OP_CHECKSIGADD;
          if (sVar5 == 1) {
            oVar7 = OP_CHECKSIG;
          }
          if (in_stack_fffffffffffffed4 != oVar7) {
            std::
            optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
            ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                        *)in_stack_fffffffffffffe88);
            goto LAB_00346aae;
          }
          prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator++
                    ((const_iterator *)in_stack_fffffffffffffe88);
        }
        sVar5 = std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                ::size((vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                        *)in_stack_fffffffffffffe88);
        if (sVar5 != 0) {
          sVar5 = std::
                  vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>::
                  size((vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                        *)in_stack_fffffffffffffe88);
          if (sVar5 < 1000) {
            data_00 = &local_60;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe88);
            bVar1 = CScript::GetOp((CScript *)
                                   CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                                   in_stack_fffffffffffffeb0,(opcodetype *)in_stack_fffffffffffffea8
                                   ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
            if (bVar1) {
              cVar6 = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
              bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator==
                                ((const_iterator *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                 (const_iterator)in_stack_fffffffffffffe98);
              if (bVar1) {
                std::
                optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                            *)in_stack_fffffffffffffe88);
              }
              else {
                puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                                   ((const_iterator *)in_stack_fffffffffffffe88);
                if (*puVar4 == 0x9c) {
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator++
                            ((const_iterator *)in_stack_fffffffffffffe88);
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
                  bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::
                          operator!=((const_iterator *)
                                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                     (const_iterator)in_stack_fffffffffffffe98);
                  if (bVar1) {
                    std::
                    optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                    ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                                *)in_stack_fffffffffffffe88);
                  }
                  else {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
                    std::
                    vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>::
                    size((vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                          *)in_stack_fffffffffffffe88);
                    in_stack_fffffffffffffe98 =
                         (_Optional_payload_base<int>)
                         GetScriptNumber(in_stack_fffffffffffffed4,data_00,
                                         (int)((ulong)cVar6.ptr >> 0x20),(int)cVar6.ptr);
                    local_10 = in_stack_fffffffffffffe98;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffe98);
                    bVar1 = std::optional::operator_cast_to_bool
                                      ((optional<int> *)in_stack_fffffffffffffe88);
                    if (bVar1) {
                      std::optional<int>::operator*((optional<int> *)in_stack_fffffffffffffe88);
                      std::
                      pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>
                      ::
                      pair<int_&,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>,_true>
                                ((pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>
                                  *)in_stack_fffffffffffffe98,
                                 (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ),
                                 (vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                                  *)in_stack_fffffffffffffe88);
                      std::
                      optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                      ::
                      optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true>
                                ((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                                  *)in_stack_fffffffffffffe98,
                                 (pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
                      std::
                      pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>
                      ::~pair(in_stack_fffffffffffffe88);
                    }
                    else {
                      std::
                      optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                      ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                                  *)in_stack_fffffffffffffe88);
                    }
                  }
                }
                else {
                  std::
                  optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                  ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                              *)in_stack_fffffffffffffe88);
                }
              }
            }
            else {
              std::
              optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
              ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                          *)in_stack_fffffffffffffe88);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe98);
            goto LAB_00346aae;
          }
        }
        std::
        optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
        ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                    *)in_stack_fffffffffffffe88);
        goto LAB_00346aae;
      }
    }
  }
  std::
  optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
  ::optional((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffe88);
LAB_00346aae:
  std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>::~vector
            ((vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_> *)
             in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<int, std::vector<Span<const unsigned char>>>> MatchMultiA(const CScript& script)
{
    std::vector<Span<const unsigned char>> keyspans;

    // Redundant, but very fast and selective test.
    if (script.size() == 0 || script[0] != 32 || script.back() != OP_NUMEQUAL) return {};

    // Parse keys
    auto it = script.begin();
    while (script.end() - it >= 34) {
        if (*it != 32) return {};
        ++it;
        keyspans.emplace_back(&*it, 32);
        it += 32;
        if (*it != (keyspans.size() == 1 ? OP_CHECKSIG : OP_CHECKSIGADD)) return {};
        ++it;
    }
    if (keyspans.size() == 0 || keyspans.size() > MAX_PUBKEYS_PER_MULTI_A) return {};

    // Parse threshold.
    opcodetype opcode;
    std::vector<unsigned char> data;
    if (!script.GetOp(it, opcode, data)) return {};
    if (it == script.end()) return {};
    if (*it != OP_NUMEQUAL) return {};
    ++it;
    if (it != script.end()) return {};
    auto threshold = GetScriptNumber(opcode, data, 1, (int)keyspans.size());
    if (!threshold) return {};

    // Construct result.
    return std::pair{*threshold, std::move(keyspans)};
}